

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O3

void __thiscall
Imf_2_5::DeepScanLineOutputFile::writePixels(DeepScanLineOutputFile *this,int numScanLines)

{
  char **this_00;
  int *piVar1;
  pthread_mutex_t *__mutex;
  pointer ppLVar2;
  LineBuffer *pLVar3;
  Int64 packedDataSize;
  Int64 unpackedDataSize;
  int iVar4;
  int iVar5;
  LineBufferTask *pLVar6;
  Data *pDVar7;
  ArgExc *pAVar8;
  IoExc *this_01;
  int iVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  void *__stat_loc;
  int number;
  int iVar14;
  int iVar15;
  ulong uVar16;
  string *psVar17;
  string *text;
  TaskGroup taskGroup;
  int local_1e4;
  int local_1cc;
  TaskGroup local_1b8 [49];
  
  __mutex = (pthread_mutex_t *)this->_data->_streamData;
  iVar4 = pthread_mutex_lock(__mutex);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  pDVar7 = this->_data;
  if ((pDVar7->slices).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (pDVar7->slices).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pAVar8 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar8,"No frame buffer specified as pixel data source.");
    __cxa_throw(pAVar8,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
  }
  iVar5 = (pDVar7->currentScanLine - pDVar7->minY) / pDVar7->linesInBuffer;
  IlmThread_2_5::TaskGroup::TaskGroup(local_1b8);
  pDVar7 = this->_data;
  iVar4 = pDVar7->currentScanLine;
  if (pDVar7->lineOrder == INCREASING_Y) {
    local_1cc = numScanLines + iVar4 + -1;
    iVar13 = (local_1cc - pDVar7->minY) / pDVar7->linesInBuffer;
    iVar9 = (iVar13 - iVar5) + 1;
    iVar14 = (int)((ulong)((long)(pDVar7->lineBuffers).
                                 super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pDVar7->lineBuffers).
                                super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3);
    if (iVar14 <= iVar9) {
      iVar9 = iVar14;
    }
    iVar14 = 1;
    if (1 < iVar9) {
      iVar14 = iVar9;
    }
    iVar9 = iVar5;
    iVar15 = iVar14;
    do {
      pLVar6 = (LineBufferTask *)operator_new(0x20);
      anon_unknown_7::LineBufferTask::LineBufferTask
                (pLVar6,local_1b8,this->_data,iVar9,iVar4,local_1cc);
      IlmThread_2_5::ThreadPool::addGlobalTask((Task *)pLVar6);
      iVar9 = iVar9 + 1;
      iVar15 = iVar15 + -1;
    } while (iVar15 != 0);
    iVar13 = iVar13 + 1;
    local_1e4 = 1;
  }
  else {
    iVar13 = ((iVar4 - (pDVar7->minY + numScanLines)) + 1) / pDVar7->linesInBuffer;
    iVar15 = (iVar4 - numScanLines) + 1;
    iVar9 = (iVar5 - iVar13) + 1;
    iVar14 = (int)((ulong)((long)(pDVar7->lineBuffers).
                                 super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pDVar7->lineBuffers).
                                super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3);
    if (iVar14 <= iVar9) {
      iVar9 = iVar14;
    }
    number = iVar5;
    iVar12 = 1;
    iVar14 = 1;
    if (1 < iVar9) {
      iVar12 = iVar9;
      iVar14 = iVar9;
    }
    do {
      pLVar6 = (LineBufferTask *)operator_new(0x20);
      anon_unknown_7::LineBufferTask::LineBufferTask
                (pLVar6,local_1b8,this->_data,number,iVar15,iVar4);
      IlmThread_2_5::ThreadPool::addGlobalTask((Task *)pLVar6);
      iVar12 = iVar12 + -1;
      number = number + -1;
    } while (iVar12 != 0);
    iVar14 = -iVar14;
    iVar13 = iVar13 + -1;
    local_1e4 = -1;
    local_1cc = iVar4;
    iVar4 = iVar15;
  }
  iVar14 = iVar5 + iVar14;
  pDVar7 = this->_data;
  if (0 < pDVar7->missingScanLines) {
    uVar16 = (ulong)iVar5;
    do {
      ppLVar2 = (pDVar7->lineBuffers).
                super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      __stat_loc = (void *)((long)(pDVar7->lineBuffers).
                                  super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar2 >> 3);
      pLVar3 = ppLVar2[uVar16 % (ulong)__stat_loc];
      this_00 = &pLVar3[1].dataPtr;
      IlmThread_2_5::Semaphore::wait((Semaphore *)this_00,__stat_loc);
      iVar5 = (*(int *)((long)&(pLVar3->_sem)._vptr_Semaphore + 4) -
              *(int *)&(pLVar3->_sem)._vptr_Semaphore) + 1;
      pDVar7 = this->_data;
      pDVar7->missingScanLines = pDVar7->missingScanLines - iVar5;
      if ((pLVar3->_sem)._semaphore.__size[8] == '\x01') {
        pDVar7->currentScanLine = pDVar7->currentScanLine + iVar5 * local_1e4;
        IlmThread_2_5::Semaphore::post((Semaphore *)this_00);
        IlmThread_2_5::TaskGroup::~TaskGroup(local_1b8);
        goto LAB_001fc32c;
      }
      packedDataSize._0_4_ = pLVar3->scanLineMin;
      packedDataSize._4_4_ = pLVar3->scanLineMax;
      unpackedDataSize._0_4_ = pLVar3->minY;
      unpackedDataSize._4_4_ = pLVar3->maxY;
      anon_unknown_7::writePixelData
                (pDVar7->_streamData,pDVar7,*(int *)((long)&(pLVar3->exception).field_2 + 8),
                 pLVar3->endOfLineBufferData,packedDataSize,unpackedDataSize,
                 (pLVar3->exception)._M_dataplus._M_p,(pLVar3->exception)._M_string_length);
      piVar1 = &this->_data->currentScanLine;
      *piVar1 = *piVar1 + iVar5 * local_1e4;
      IlmThread_2_5::Semaphore::post((Semaphore *)this_00);
      uVar16 = uVar16 + (long)local_1e4;
      if (iVar13 == (int)uVar16) {
        IlmThread_2_5::TaskGroup::~TaskGroup(local_1b8);
        ppLVar2 = (this->_data->lineBuffers).
                  super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar10 = (long)(this->_data->lineBuffers).
                       super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar2;
        if (lVar10 != 0) {
          lVar10 = lVar10 >> 3;
          lVar11 = 0;
          psVar17 = (string *)0x0;
          do {
            pLVar3 = ppLVar2[lVar11];
            text = (string *)((long)&(pLVar3->_sem)._semaphore + 0x10);
            if (psVar17 != (string *)0x0) {
              text = psVar17;
            }
            if ((pLVar3->_sem)._semaphore.__size[9] == '\0') {
              text = psVar17;
            }
            (pLVar3->_sem)._semaphore.__size[9] = '\0';
            lVar11 = lVar11 + 1;
            psVar17 = text;
          } while (lVar10 + (ulong)(lVar10 == 0) != lVar11);
          if (text != (string *)0x0) {
            this_01 = (IoExc *)__cxa_allocate_exception(0x48);
            Iex_2_5::IoExc::IoExc(this_01,text);
            __cxa_throw(this_01,&Iex_2_5::IoExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
          }
        }
LAB_001fc32c:
        pthread_mutex_unlock(__mutex);
        return;
      }
      iVar5 = iVar13;
      if (iVar14 != iVar13) {
        pLVar6 = (LineBufferTask *)operator_new(0x20);
        anon_unknown_7::LineBufferTask::LineBufferTask
                  (pLVar6,local_1b8,this->_data,iVar14,iVar4,local_1cc);
        IlmThread_2_5::ThreadPool::addGlobalTask((Task *)pLVar6);
        iVar5 = iVar14 + local_1e4;
      }
      iVar14 = iVar5;
      pDVar7 = this->_data;
    } while (0 < pDVar7->missingScanLines);
  }
  pAVar8 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc
            (pAVar8,"Tried to write more scan lines than specified by the data window.");
  __cxa_throw(pAVar8,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
}

Assistant:

void
DeepScanLineOutputFile::writePixels (int numScanLines)
{
    try
    {
        Lock lock (*_data->_streamData);

        if (_data->slices.size() == 0)
            throw IEX_NAMESPACE::ArgExc ("No frame buffer specified "
                               "as pixel data source.");

        //
        // Maintain two iterators:
        //     nextWriteBuffer: next linebuffer to be written to the file
        //     nextCompressBuffer: next linebuffer to compress
        //

        int first = (_data->currentScanLine - _data->minY) /
                         _data->linesInBuffer;

        int nextWriteBuffer = first;
        int nextCompressBuffer;
        int stop;
        int step;
        int scanLineMin;
        int scanLineMax;

        {
            //
            // Create a task group for all line buffer tasks. When the
            // taskgroup goes out of scope, the destructor waits until
            // all tasks are complete.
            //

            TaskGroup taskGroup;

            //
            // Determine the range of lineBuffers that intersect the scan
            // line range.  Then add the initial compression tasks to the
            // thread pool.  We always add in at least one task but the
            // individual task might not do anything if numScanLines == 0.
            //

            if (_data->lineOrder == INCREASING_Y)
            {
                int last = (_data->currentScanLine + (numScanLines - 1) -
                            _data->minY) / _data->linesInBuffer;

                scanLineMin = _data->currentScanLine;
                scanLineMax = _data->currentScanLine + numScanLines - 1;

                int numTasks = max (min ((int)_data->lineBuffers.size(),
                                         last - first + 1),
                                    1);

                for (int i = 0; i < numTasks; i++)
                {
                    ThreadPool::addGlobalTask
                        (new LineBufferTask (&taskGroup, _data, first + i,
                                             scanLineMin, scanLineMax));
                }

                nextCompressBuffer = first + numTasks;
                stop = last + 1;
                step = 1;
            }
            else
            {
                int last = (_data->currentScanLine - (numScanLines - 1) -
                            _data->minY) / _data->linesInBuffer;

                scanLineMax = _data->currentScanLine;
                scanLineMin = _data->currentScanLine - numScanLines + 1;

                int numTasks = max (min ((int)_data->lineBuffers.size(),
                                         first - last + 1),
                                    1);

                for (int i = 0; i < numTasks; i++)
                {
                    ThreadPool::addGlobalTask
                        (new LineBufferTask (&taskGroup, _data, first - i,
                                             scanLineMin, scanLineMax));
                }

                nextCompressBuffer = first - numTasks;
                stop = last - 1;
                step = -1;
            }

            while (true)
            {
                if (_data->missingScanLines <= 0)
                {
                    throw IEX_NAMESPACE::ArgExc ("Tried to write more scan lines "
                                       "than specified by the data window.");
                }

                //
                // Wait until the next line buffer is ready to be written
                //

                LineBuffer *writeBuffer =
                    _data->getLineBuffer (nextWriteBuffer);

                writeBuffer->wait();

                int numLines = writeBuffer->scanLineMax -
                               writeBuffer->scanLineMin + 1;

                _data->missingScanLines -= numLines;

                //
                // If the line buffer is only partially full, then it is
                // not complete and we cannot write it to disk yet.
                //

                if (writeBuffer->partiallyFull)
                {
                    _data->currentScanLine = _data->currentScanLine +
                                             step * numLines;
                    writeBuffer->post();

                    return;
                }

                //
                // Write the line buffer
                //

                writePixelData (_data->_streamData, _data, writeBuffer);
                nextWriteBuffer += step;

                _data->currentScanLine = _data->currentScanLine +
                                         step * numLines;

                #ifdef DEBUG

                    assert (_data->currentScanLine ==
                            ((_data->lineOrder == INCREASING_Y) ?
                             writeBuffer->scanLineMax + 1:
                             writeBuffer->scanLineMin - 1));

                #endif

                //
                // Release the lock on the line buffer
                //

                writeBuffer->post();

                //
                // If this was the last line buffer in the scanline range
                //

                if (nextWriteBuffer == stop)
                    break;

                //
                // If there are no more line buffers to compress,
                // then only continue to write out remaining lineBuffers
                //

                if (nextCompressBuffer == stop)
                    continue;

                //
                // Add nextCompressBuffer as a compression task
                //

                ThreadPool::addGlobalTask
                    (new LineBufferTask (&taskGroup, _data, nextCompressBuffer,
                                         scanLineMin, scanLineMax));

                //
                // Update the next line buffer we need to compress
                //

                nextCompressBuffer += step;
            }

            //
            // Finish all tasks
            //
        }

        //
        // Exeption handling:
        //
        // LineBufferTask::execute() may have encountered exceptions, but
        // those exceptions occurred in another thread, not in the thread
        // that is executing this call to OutputFile::writePixels().
        // LineBufferTask::execute() has caught all exceptions and stored
        // the exceptions' what() strings in the line buffers.
        // Now we check if any line buffer contains a stored exception; if
        // this is the case then we re-throw the exception in this thread.
        // (It is possible that multiple line buffers contain stored
        // exceptions.  We re-throw the first exception we find and
        // ignore all others.)
        //

        const string *exception = 0;

        for (size_t i = 0; i < _data->lineBuffers.size(); ++i)
        {
            LineBuffer *lineBuffer = _data->lineBuffers[i];

            if (lineBuffer->hasException && !exception)
                exception = &lineBuffer->exception;

            lineBuffer->hasException = false;
        }

        if (exception)
            throw IEX_NAMESPACE::IoExc (*exception);
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        REPLACE_EXC (e, "Failed to write pixel data to image "
                     "file \"" << fileName() << "\". " << e.what());
        throw;
    }
}